

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void EthBasePort::PrintEthernetPacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  long lVar1;
  char cVar2;
  ostream oVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Ethernet Frame:",0xf);
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  PrintMAC(out,"  Dest MAC",(uint8_t *)packet,true);
  PrintMAC(out,"  Src MAC",(uint8_t *)((long)packet + 6),true);
  std::__ostream_insert<char,std::char_traits<char>>(out,"  Ethertype/Length: ",0x14);
  lVar6 = *(long *)out;
  *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 4;
  poVar4 = out + *(long *)(lVar6 + -0x18);
  if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar3;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x30;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if ((short)packet[3] == 0x806) {
    pcVar7 = " (ARP)";
    lVar6 = 6;
LAB_00115797:
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
  }
  else if ((short)packet[3] == 0x800) {
    pcVar7 = " (IPv4)";
    lVar6 = 7;
    goto LAB_00115797;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if ((short)packet[3] == 0x806) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  ARP:",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>(out,"    htype:",10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ptype:",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", hlen:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", plen: ",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", oper:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    lVar6 = *(long *)poVar4;
    lVar1 = *(long *)(lVar6 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    PrintMAC(out,"    Src MAC",(uint8_t *)((long)packet + 0x2a),true);
    PrintIP(out,"    Src IP",(uint8_t *)(packet + 0xc),true);
    PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x3a),true);
    return;
  }
  if ((short)packet[3] == 0x800) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  IPv4:",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"    Version: ",0xd);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)out,(uint)(*(ushort *)((long)packet + 0xe) >> 0xc))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", IHL: ",7);
    plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,*(byte *)((long)packet + 0xf) & 0xf)
    ;
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"    Length: ",0xc);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"    Flags: ",0xb);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(out,", TTL: ",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"    Protocol: ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
    if (*(char *)((long)packet + 0x16) == '\x11') {
      pcVar7 = " (UDP)";
      lVar6 = 6;
LAB_00115bbd:
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
    }
    else if (*(char *)((long)packet + 0x16) == '\x01') {
      pcVar7 = " (ICMP)";
      lVar6 = 7;
      goto LAB_00115bbd;
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    PrintIP(out,"    Host IP",(uint8_t *)((long)packet + 0x1a),true);
    PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x1e),true);
    if (*(char *)((long)packet + 0x16) == '\x11') {
      std::__ostream_insert<char,std::char_traits<char>>(out,"    UDP:",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(out,"      Host Port: ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(out,"      Dest Port: ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(out,"      Length: ",0xe);
      out = std::ostream::_M_insert<unsigned_long>((ulong)out);
      lVar6 = *(long *)out;
      goto LAB_00115e14;
    }
    if (*(char *)((long)packet + 0x16) != '\x01') {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"    ICMP:",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"      Type: ",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Code: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if ((*(char *)((long)packet + 0x23) == '\b') && (*(char *)((long)packet + 0x22) == '\0')) {
      pcVar7 = " (Echo Request)";
      lVar6 = 0xf;
      goto LAB_00115ba4;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  Raw frame (len = ",0x13);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    out = std::ostream::_M_insert<unsigned_long>((ulong)out);
    pcVar7 = ")";
    lVar6 = 1;
LAB_00115ba4:
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
  }
  lVar6 = *(long *)out;
LAB_00115e14:
  std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintEthernetPacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    struct FrameHeader {
        uint8_t  destMac[6];
        uint8_t  srcMac[6];
        uint16_t etherType;
    };
    struct IPv4Header {
        uint16_t word0;
        uint16_t length;
        uint16_t ident;
        uint16_t flags;
        uint8_t  protocol;
        uint8_t  ttl;
        uint16_t checksum;
        uint8_t  hostIP[4];
        uint8_t  destIP[4];
    };
    struct UDPHeader {
        uint16_t hostPort;
        uint16_t destPort;
        uint16_t length;
        uint16_t checksum;
    };
    struct ARPHeader {
        uint16_t htype;
        uint16_t ptype;
        uint8_t  plen;
        uint8_t  hlen;
        uint16_t oper;
        uint8_t  srcMac[6];
        uint8_t  srcIP[4];
        uint8_t  destMac[6];  // ignored
        uint8_t  destIP[4];
    };
    // Easier to work with 16-bit data, since that is how it is stored on FPGA.
    const uint16_t *packetw = reinterpret_cast<const uint16_t *>(packet);

    const FrameHeader *frame = reinterpret_cast<const FrameHeader *>(packetw);
    out << "Ethernet Frame:" << std::endl;
    EthBasePort::PrintMAC(out, "  Dest MAC", frame->destMac, true);
    EthBasePort::PrintMAC(out, "  Src MAC", frame->srcMac, true);
    out << "  Ethertype/Length: " << std::hex << std::setw(4) << std::setfill('0') << frame->etherType << std::dec;
    if (frame->etherType == 0x0800) out << " (IPv4)";
    else if (frame->etherType == 0x0806) out << " (ARP)";
    out << std::endl;
    if (frame->etherType == 0x0800) {
        const IPv4Header *ipv4 = reinterpret_cast<const IPv4Header *>(packetw+7);
        out << "  IPv4:" << std::endl;
        out << "    Version: " << std::dec << ((ipv4->word0&0xf000)>>12) << ", IHL: " << ((ipv4->word0&0x0f00)>>8) << std::endl;
        out << "    Length: " << std::dec << ipv4->length << std::endl;
        unsigned int flags = (ipv4->flags&0xc0)>>13;
        out << "    Flags: " << std::dec << flags;
        if (flags == 2) out << " (DF)";
        out << ", TTL: " << static_cast<unsigned int>(ipv4->ttl) << std::endl;
        out << "    Protocol: " << static_cast<unsigned int>(ipv4->protocol);
        if (ipv4->protocol == 1) out << " (ICMP)";
        else if (ipv4->protocol == 17) out << " (UDP)";
        out << std::endl;
        EthBasePort::PrintIP(out, "    Host IP", ipv4->hostIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", ipv4->destIP, true);
        if (ipv4->protocol == 1) {
            const uint8_t *icmp = reinterpret_cast<const uint8_t *>(packetw+17);
            out << "    ICMP:" << std::endl;
            out << "      Type: " << static_cast<unsigned int>(icmp[1])
                << ", Code: " << static_cast<unsigned int>(icmp[0]);
            if ((icmp[1] == 8) && (icmp[0] == 0)) out << " (Echo Request)";
            out << std::endl;
        }
        else if (ipv4->protocol == 17) {
            const UDPHeader *udp = reinterpret_cast<const UDPHeader *>(packetw+17);
            out << "    UDP:" << std::endl;
            out << std::dec << "      Host Port: " << udp->hostPort << std::endl;
            out << std::dec << "      Dest Port: " << udp->destPort << std::endl;
            out << std::dec << "      Length: " << udp->length << std::endl;
        }
    }
    else if (frame->etherType == 0x0806) {
        const ARPHeader *arp = reinterpret_cast<const ARPHeader *>(packetw+17);
        out << "  ARP:" << std::endl;
        out << std::hex << "    htype:" << arp->htype << ", ptype:" << arp->ptype
            << ", hlen:" << static_cast<unsigned int>(arp->hlen)
            << ", plen: " << static_cast<unsigned int>(arp->plen)
            << ", oper:" << arp->oper << std::dec << std::endl;
        EthBasePort::PrintMAC(out, "    Src MAC", arp->srcMac, true);
        EthBasePort::PrintIP(out, "    Src IP", arp->srcIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", arp->destIP, true);
    }
    else {
        out << "  Raw frame (len = " << std::dec << frame->etherType << ")" << std::endl;
    }
}